

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int FN_Down_Field(FORM *form)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  unsigned_short uVar4;
  int iVar5;
  WINDOW_conflict *pWVar6;
  FIELD *field_on_page_1;
  FIELD *pFVar7;
  FIELD *field;
  FIELD *field_on_page;
  
  field = form->current;
  psVar1 = &field->frow;
  psVar2 = &field->fcol;
  pFVar7 = field;
LAB_003a074e:
  do {
    field = field->snext;
    if (field != pFVar7) {
      if ((field->opts & 3U) != 3) goto LAB_003a074e;
    }
    psVar3 = &field->frow;
    if (*psVar3 != *psVar1) goto LAB_003a0779;
    pFVar7 = field;
  } while (field->fcol != *psVar2);
  goto LAB_003a07c1;
code_r0x0039f176:
  if (field == (FIELD *)0x0 || form == (FORM *)0x0) {
    return -2;
  }
  pFVar7 = form->current;
  if (pFVar7 == (FIELD *)0x0) {
    return -2;
  }
  if (field->form != form) {
    return -2;
  }
  if ((form->status & 2) != 0) {
    return -5;
  }
  if (form->field == (FIELD **)0x0) {
    return -0xb;
  }
  if ((pFVar7 == field & (byte)form->status) != 0) goto LAB_0039f349;
  if (((form->w != (WINDOW_conflict *)0x0) && ((pFVar7->opts & 1) != 0)) &&
     (pFVar7->form->curpage == pFVar7->page)) {
    _nc_Refresh_Current_Field(form);
    if ((pFVar7->opts & 4U) != 0) {
      if ((int)pFVar7->rows < pFVar7->drows) {
        if (form->toprow == 0) {
          uVar4 = pFVar7->status & 0xfffd;
        }
        else {
          uVar4 = pFVar7->status | 2;
        }
        pFVar7->status = uVar4;
      }
      else if (((pFVar7->just != 0) && ((int)pFVar7->rows + pFVar7->nrow == 1)) &&
              ((((uint)pFVar7->opts >> 9 & 1) != 0 && (pFVar7->dcols == (int)pFVar7->cols)))) {
        Window_To_Buffer(form->w,pFVar7);
        werase(form->w);
        Perform_Justification(pFVar7,form->w);
        wsyncup(form->w);
      }
    }
    delwin(form->w);
  }
  if ((((field->opts & 4) == 0) || ((int)field->rows < field->drows)) ||
     ((int)field->cols < field->dcols)) {
    pWVar6 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
  }
  else {
    pWVar6 = form->sub;
    if ((form->sub == (WINDOW_conflict *)0x0) &&
       (pWVar6 = form->win, form->win == (WINDOW_conflict *)0x0)) {
      pWVar6 = _stdscr;
    }
    pWVar6 = (WINDOW_conflict *)
             derwin(pWVar6,(int)field->rows,(int)field->cols,(int)field->frow,(int)field->fcol);
  }
  if (pWVar6 == (WINDOW_conflict *)0x0) {
    return -1;
  }
  form->current = field;
  form->w = pWVar6;
  *(byte *)&form->status = (byte)form->status & 0xef;
  wbkgdset(pWVar6,field->back | field->pad);
  wattrset(form->w,field->fore);
  if (((field->opts & 4U) == 0) || ((int)field->rows < field->drows)) {
LAB_0039f30e:
    werase(form->w);
    Buffer_To_Window(field,form->w);
  }
  else {
    if ((int)field->cols < field->dcols) goto LAB_0039f30e;
    if ((((field->just != 0) && (((uint)field->opts >> 9 & 1) != 0)) &&
        (field->dcols == (int)field->cols)) && ((int)field->rows + field->nrow == 1)) {
      werase(form->w);
      Undo_Justification(field,form->w);
      wsyncup(form->w);
    }
  }
  pWVar6 = form->w;
  if (pWVar6 == (WINDOW_conflict *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = pWVar6->_maxy + 1;
  }
  wtouchln(pWVar6,0,iVar5,0);
LAB_0039f349:
  form->currow = 0;
  form->curcol = 0;
  form->toprow = 0;
  form->begincol = 0;
  return 0;
LAB_003a0779:
  do {
    pFVar7 = field;
    if (*psVar2 <= field->fcol) goto code_r0x0039f176;
    do {
      pFVar7 = pFVar7->snext;
      if (pFVar7 == field) break;
    } while ((pFVar7->opts & 3U) != 3);
    field = pFVar7;
  } while (pFVar7->frow == *psVar3);
  do {
    field = field->sprev;
    if (field == pFVar7) goto code_r0x0039f176;
  } while ((field->opts & 3U) != 3);
LAB_003a07c1:
  iVar5 = _nc_Set_Current_Field(form,field);
  return iVar5;
}

Assistant:

static int FN_Down_Field(FORM * form)
{
  return _nc_Set_Current_Field(form,
                               Down_Neighbour_Field(form->current));
}